

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSAX2ProcessingInstruction(void)

{
  int iVar1;
  int iVar2;
  void *val;
  xmlChar *val_00;
  xmlChar *val_01;
  int local_3c;
  int n_data;
  xmlChar *data;
  int n_target;
  xmlChar *target;
  int n_ctx;
  void *ctx;
  int mem_base;
  int test_ret;
  
  ctx._4_4_ = 0;
  for (target._4_4_ = 0; (int)target._4_4_ < 2; target._4_4_ = target._4_4_ + 1) {
    for (data._4_4_ = 0; (int)data._4_4_ < 5; data._4_4_ = data._4_4_ + 1) {
      for (local_3c = 0; local_3c < 5; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_void_ptr(target._4_4_,0);
        val_00 = gen_const_xmlChar_ptr(data._4_4_,1);
        val_01 = gen_const_xmlChar_ptr(local_3c,2);
        xmlSAX2ProcessingInstruction(val,val_00,val_01);
        call_tests = call_tests + 1;
        des_void_ptr(target._4_4_,val,0);
        des_const_xmlChar_ptr(data._4_4_,val_00,1);
        des_const_xmlChar_ptr(local_3c,val_01,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSAX2ProcessingInstruction",
                 (ulong)(uint)(iVar2 - iVar1));
          ctx._4_4_ = ctx._4_4_ + 1;
          printf(" %d",(ulong)target._4_4_);
          printf(" %d",(ulong)data._4_4_);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ctx._4_4_;
}

Assistant:

static int
test_xmlSAX2ProcessingInstruction(void) {
    int test_ret = 0;

    int mem_base;
    void * ctx; /* the user data (XML parser context) */
    int n_ctx;
    const xmlChar * target; /* the target name */
    int n_target;
    const xmlChar * data; /* the PI data's */
    int n_data;

    for (n_ctx = 0;n_ctx < gen_nb_void_ptr;n_ctx++) {
    for (n_target = 0;n_target < gen_nb_const_xmlChar_ptr;n_target++) {
    for (n_data = 0;n_data < gen_nb_const_xmlChar_ptr;n_data++) {
        mem_base = xmlMemBlocks();
        ctx = gen_void_ptr(n_ctx, 0);
        target = gen_const_xmlChar_ptr(n_target, 1);
        data = gen_const_xmlChar_ptr(n_data, 2);

        xmlSAX2ProcessingInstruction(ctx, target, data);
        call_tests++;
        des_void_ptr(n_ctx, ctx, 0);
        des_const_xmlChar_ptr(n_target, target, 1);
        des_const_xmlChar_ptr(n_data, data, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSAX2ProcessingInstruction",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctx);
            printf(" %d", n_target);
            printf(" %d", n_data);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}